

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

VectorMax3d * __thiscall
SimpleBVH::BVH::point_callback(VectorMax3d *__return_storage_ptr__,BVH *this,int f)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  Index size;
  double *pdVar4;
  ActualDstType actualDst;
  ulong uVar5;
  int local_14;
  
  if ((this->getPoint).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (((this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols & 0xfffffffffffffffeU) != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x238,"VectorMax3d SimpleBVH::BVH::point_callback(int) const");
    }
    if ((f < 0) ||
       ((this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        <= (long)f)) {
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x77,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<int, -1, -1>, Level = 0]"
                   );
    }
    pdVar4 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    uVar2 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    if ((long)uVar2 < 0 && pdVar4 != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                   );
    }
    iVar1 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
            m_data[f];
    if ((iVar1 < 0) ||
       (lVar3 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows, lVar3 <= iVar1)) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                   );
    }
    if (3 < uVar2) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                   );
    }
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
    m_storage.m_rows = uVar2;
    if (uVar2 != 0) {
      pdVar4 = pdVar4 + iVar1;
      uVar5 = 0;
      do {
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
        m_storage.m_data.array[uVar5] = *pdVar4;
        uVar5 = uVar5 + 1;
        pdVar4 = pdVar4 + lVar3;
      } while (uVar2 != uVar5);
    }
  }
  else {
    (*(this->getPoint)._M_invoker)(__return_storage_ptr__,(_Any_data *)&this->getPoint,&local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorMax3d BVH::point_callback(int f) const
{
    if (getPoint) {
        return getPoint(f);
    }

    if (faces.cols() == 2 || faces.cols() == 3) {
        return vertices.row(faces(f, 0));
    }

    assert(false);
    return VectorMax3d(3);
}